

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O0

uint32_t read32_be(uint8_t *buf)

{
  uint8_t *buf_local;
  
  return (uint)*buf << 0x18 | (uint)buf[1] << 0x10 | (uint)buf[2] << 8 | (uint)buf[3];
}

Assistant:

static inline uint32_t read32_be(const uint8_t buf[4])
{
  return (buf[0] << 24) |
         (buf[1] << 16) |
         (buf[2] << 8) |
         (buf[3]);
}